

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker stroker,SW_FT_Outline *outline)

{
  SW_FT_Vector *pSVar1;
  char *pcVar2;
  SW_FT_Pos *pSVar3;
  uint uVar4;
  SW_FT_Vector *pSVar5;
  uint uVar6;
  SW_FT_Vector *pSVar7;
  SW_FT_Vector *pSVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  SW_FT_Vector v_control;
  SW_FT_Vector v_start;
  SW_FT_Vector vec;
  SW_FT_Vector local_98;
  SW_FT_Vector local_88;
  undefined4 uStack_78;
  int iStack_74;
  SW_FT_Outline *local_70;
  SW_FT_Vector vec2;
  SW_FT_Vector vec_1;
  
  if (stroker == (SW_FT_Stroker)0x0 || outline == (SW_FT_Outline *)0x0) {
    return -1;
  }
  stroker->borders[0].num_points = 0;
  stroker->borders[0].start = -1;
  lVar10 = 0;
  stroker->borders[0].valid = '\0';
  stroker->borders[1].num_points = 0;
  stroker->borders[1].start = -1;
  stroker->borders[1].valid = '\0';
  uVar4 = 0;
  local_70 = outline;
  do {
    if (outline->n_contours <= lVar10) {
      return 0;
    }
    uVar6 = (uint)outline->contours[lVar10];
    if (uVar4 < uVar6) {
      pSVar1 = outline->points;
      pSVar5 = pSVar1 + uVar6;
      pSVar7 = pSVar1 + uVar4;
      lVar11 = pSVar1[uVar4].x;
      local_88.y = pSVar1[uVar4].y;
      local_88.x = pSVar5->x;
      pSVar3 = &pSVar5->y;
      local_98.x = pSVar1[uVar4].x;
      local_98.y = pSVar1[uVar4].y;
      pcVar2 = outline->tags;
      pbVar9 = (byte *)(pcVar2 + uVar4);
      if ((pcVar2[uVar4] & 3U) == 0) {
        if ((pcVar2[uVar6] & 3U) == 1) {
          pSVar5 = pSVar5 + -1;
          local_88.y = *pSVar3;
        }
        else {
          local_88.x = local_88.x + lVar11;
          lVar11 = *pSVar3 + local_88.y;
          uVar12 = local_88.x - (local_88.x >> 0x3f);
          uVar13 = lVar11 - (lVar11 >> 0x3f);
          iStack_74 = (int)((long)uVar13 >> 0x21);
          uStack_78 = (undefined4)(uVar13 >> 1);
          local_88.x = CONCAT44((int)((long)uVar12 >> 0x21),(int)(uVar12 >> 1));
        }
        pSVar7 = pSVar7 + -1;
        pbVar9 = pbVar9 + -1;
      }
      else {
        local_88.x = lVar11;
        if ((pcVar2[uVar4] & 3U) == 2) {
          return -2;
        }
      }
      SW_FT_Stroker_BeginSubPath(stroker,&local_88,local_70->contours_flag[lVar10]);
      while (pSVar7 < pSVar5) {
        if ((pbVar9[1] & 3) == 0) {
          local_98.x = pSVar7[1].x;
          local_98.y = pSVar7[1].y;
          pSVar7 = pSVar7 + 2;
          pbVar9 = pbVar9 + 2;
          while( true ) {
            if (pSVar5 <= pSVar7 + -1) {
              SW_FT_Stroker_ConicTo(stroker,&local_98,&local_88);
              goto LAB_0010a7a7;
            }
            vec.x = pSVar7->x;
            vec.y = pSVar7->y;
            if ((*pbVar9 & 3) != 0) break;
            uVar12 = (vec.x + local_98.x) - (vec.x + local_98.x >> 0x3f);
            vec2.x = CONCAT44((int)((long)uVar12 >> 0x21),(int)(uVar12 >> 1));
            SW_FT_Stroker_ConicTo(stroker,&local_98,&vec2);
            local_98.x = vec.x;
            local_98.y = vec.y;
            pSVar7 = pSVar7 + 1;
            pbVar9 = pbVar9 + 1;
          }
          if ((*pbVar9 & 3) != 1) {
            return -2;
          }
          SW_FT_Stroker_ConicTo(stroker,&local_98,&vec);
        }
        else {
          pSVar1 = pSVar7 + 1;
          if ((pbVar9[1] & 3) == 1) {
            pbVar9 = pbVar9 + 1;
            vec.x = pSVar1->x;
            vec.y = pSVar7[1].y;
            SW_FT_Stroker_LineTo(stroker,&vec);
            pSVar7 = pSVar1;
          }
          else {
            if (pSVar5 < pSVar7 + 2) {
              return -2;
            }
            if ((pbVar9[2] & 3) != 2) {
              return -2;
            }
            pSVar8 = pSVar7 + 3;
            vec.x = pSVar1->x;
            vec.y = pSVar7[1].y;
            vec2.x = pSVar7[2].x;
            vec2.y = pSVar7[2].y;
            if (pSVar5 < pSVar8) {
              SW_FT_Stroker_CubicTo(stroker,&vec,&vec2,&local_88);
              break;
            }
            pbVar9 = pbVar9 + 3;
            vec_1.x = pSVar8->x;
            vec_1.y = pSVar7[3].y;
            SW_FT_Stroker_CubicTo(stroker,&vec,&vec2,&vec_1);
            pSVar7 = pSVar8;
          }
        }
      }
LAB_0010a7a7:
      outline = local_70;
      if (stroker->first_point == '\0') {
        SW_FT_Stroker_EndSubPath(stroker);
      }
    }
    uVar4 = uVar6 + 1;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

SW_FT_Error SW_FT_Stroker_ParseOutline(SW_FT_Stroker        stroker,
                                       const SW_FT_Outline* outline)
{
    SW_FT_Vector v_last;
    SW_FT_Vector v_control;
    SW_FT_Vector v_start;

    SW_FT_Vector* point;
    SW_FT_Vector* limit;
    char*         tags;

    SW_FT_Error error;

    SW_FT_Int  n;     /* index of contour in outline     */
    SW_FT_UInt first; /* index of first point in contour */
    SW_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // SW_FT_THROW( Invalid_Argument );

    SW_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        SW_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = SW_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == SW_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == SW_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (SW_FT_CURVE_TAG(outline->tags[last]) == SW_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = SW_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = SW_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case SW_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                SW_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = SW_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case SW_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    SW_FT_Vector vec;
                    SW_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = SW_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == SW_FT_CURVE_TAG_ON) {
                        error =
                            SW_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != SW_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        SW_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = SW_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* SW_FT_CURVE_TAG_CUBIC */
            {
                SW_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    SW_FT_CURVE_TAG(tags[1]) != SW_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    SW_FT_Vector vec;

                    vec = point[0];

                    error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = SW_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        /* don't try to end the path if no segments have been generated */
        if (!stroker->first_point) {
            error = SW_FT_Stroker_EndSubPath(stroker);
            if (error) goto Exit;
        }

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // SW_FT_THROW( Invalid_Outline );
}